

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O3

ParseState
icu_63::number::impl::skeleton::parseStem
          (StringSegment *segment,UCharsTrie *stemTrie,SeenMacroProps *seen,MacroProps *macros,
          UErrorCode *status)

{
  char16_t *pcVar1;
  FractionSignificantSettings FVar2;
  char16_t cVar3;
  UStringTrieResult UVar4;
  UNumberDecimalSeparatorDisplay UVar5;
  char16_t *pcVar6;
  NumberingSystem *ns;
  StemEnum SVar7;
  Notation NVar8;
  Grouper GVar9;
  Precision local_48;
  
  cVar3 = numparse::impl::StringSegment::charAt(segment,0);
  if (cVar3 == L'@') {
    if (seen->precision != true) {
      seen->precision = true;
      blueprint_helpers::parseDigitsStem(segment,macros,status);
      return STATE_NULL;
    }
  }
  else if (cVar3 == L'.') {
    if (seen->precision != true) {
      seen->precision = true;
      blueprint_helpers::parseFractionStem(segment,macros,status);
      return STATE_FRACTION_PRECISION;
    }
  }
  else {
    UVar4 = UCharsTrie::current(stemTrie);
    if (0xfffffffd < UVar4 + ~USTRINGTRIE_INTERMEDIATE_VALUE) {
      pcVar1 = stemTrie->pos_;
      pcVar6 = pcVar1 + 1;
      cVar3 = *pcVar1;
      if (cVar3 < L'\0') {
        SVar7 = (ushort)cVar3 & 0x7fff;
        if (0x3fff < SVar7) {
          if (SVar7 == 0x7fff) {
            SVar7 = (uint)(ushort)pcVar1[1] << 0x10;
            pcVar6 = pcVar1 + 2;
          }
          else {
            SVar7 = SVar7 * 0x10000 + 0xc0000000;
          }
          SVar7 = (ushort)*pcVar6 | SVar7;
        }
      }
      else if ((ushort)cVar3 < 0x4040) {
        SVar7 = ((ushort)cVar3 >> 6) - STEM_COMPACT_LONG;
      }
      else if ((ushort)cVar3 < 0x7fc0) {
        SVar7 = ((ushort)cVar3 & 0x7fc0) * 0x400 + (uint)(ushort)*pcVar6 + 0xfeff0000;
      }
      else {
        SVar7 = CONCAT22(pcVar1[1],pcVar1[2]);
      }
      switch(SVar7) {
      case STEM_COMPACT_SHORT:
      case STEM_COMPACT_LONG:
      case STEM_SCIENTIFIC:
      case STEM_ENGINEERING:
      case STEM_NOTATION_SIMPLE:
        if (seen->notation != true) {
          seen->notation = true;
          NVar8 = stem_to_object::notation(SVar7);
          macros->notation = NVar8;
          return (uint)((SVar7 & ~STEM_COMPACT_LONG) == STEM_SCIENTIFIC);
        }
        break;
      case STEM_BASE_UNIT:
      case STEM_PERCENT:
      case STEM_PERMILLE:
        if (seen->unit != true) {
          seen->unit = true;
          stem_to_object::unit((MeasureUnit *)&local_48,SVar7);
          MeasureUnit::operator=(&macros->unit,(MeasureUnit *)&local_48);
          MeasureUnit::~MeasureUnit((MeasureUnit *)&local_48);
          return STATE_NULL;
        }
        break;
      case STEM_PRECISION_INTEGER:
      case STEM_PRECISION_UNLIMITED:
      case STEM_PRECISION_CURRENCY_STANDARD:
      case STEM_PRECISION_CURRENCY_CASH:
        if (seen->precision != true) {
          seen->precision = true;
          stem_to_object::precision(&local_48,SVar7);
          FVar2.fMinSig = local_48.fUnion.fracSig.fMinSig;
          FVar2.fMaxSig = local_48.fUnion.fracSig.fMaxSig;
          FVar2.fMinFrac = local_48.fUnion.fracSig.fMinFrac;
          FVar2.fMaxFrac = local_48.fUnion.fracSig.fMaxFrac;
          *(ulong *)((long)&(macros->precision).fUnion.increment.fIncrement + 4) =
               CONCAT44(local_48.fUnion._8_4_,local_48.fUnion._4_4_);
          *(undefined8 *)((long)&(macros->precision).fUnion + 0xc) = local_48._20_8_;
          (macros->precision).fType = local_48.fType;
          *(undefined4 *)&(macros->precision).field_0x4 = local_48._4_4_;
          (macros->precision).fUnion.fracSig = FVar2;
          return (uint)(SVar7 == STEM_PRECISION_INTEGER) * 2;
        }
        break;
      case STEM_ROUNDING_MODE_CEILING:
      case STEM_ROUNDING_MODE_FLOOR:
      case STEM_ROUNDING_MODE_DOWN:
      case STEM_ROUNDING_MODE_UP:
      case STEM_ROUNDING_MODE_HALF_EVEN:
      case STEM_ROUNDING_MODE_HALF_DOWN:
      case STEM_ROUNDING_MODE_HALF_UP:
      case STEM_ROUNDING_MODE_UNNECESSARY:
        if (seen->roundingMode != true) {
          seen->roundingMode = true;
          macros->roundingMode = SVar7 - 0xc;
          return STATE_NULL;
        }
        break;
      case STEM_GROUP_OFF:
      case STEM_GROUP_MIN2:
      case STEM_GROUP_AUTO:
      case STEM_GROUP_ON_ALIGNED:
      case STEM_GROUP_THOUSANDS:
        if (seen->grouper != true) {
          seen->grouper = true;
          GVar9 = Grouper::forStrategy(SVar7 - 0x14);
          macros->grouper = GVar9;
          return STATE_NULL;
        }
        break;
      case STEM_LATIN:
        if (seen->symbols != true) {
          seen->symbols = true;
          ns = NumberingSystem::createInstanceByName("latn",status);
          SymbolsWrapper::setTo(&macros->symbols,ns);
          return STATE_NULL;
        }
        break;
      case STEM_UNIT_WIDTH_NARROW:
      case STEM_UNIT_WIDTH_SHORT:
      case STEM_UNIT_WIDTH_FULL_NAME:
      case STEM_UNIT_WIDTH_ISO_CODE:
      case STEM_UNIT_WIDTH_HIDDEN:
        if (seen->unitWidth != true) {
          seen->unitWidth = true;
          macros->unitWidth = SVar7 - 0x1a;
          return STATE_NULL;
        }
        break;
      case STEM_SIGN_AUTO:
      case STEM_SIGN_ALWAYS:
      case STEM_SIGN_NEVER:
      case STEM_SIGN_ACCOUNTING:
      case STEM_SIGN_ACCOUNTING_ALWAYS:
      case STEM_SIGN_EXCEPT_ZERO:
      case STEM_SIGN_ACCOUNTING_EXCEPT_ZERO:
        if (seen->sign != true) {
          seen->sign = true;
          macros->sign = SVar7 - 0x1f;
          return STATE_NULL;
        }
        break;
      case STEM_DECIMAL_AUTO:
      case STEM_DECIMAL_ALWAYS:
        if (seen->decimal != true) {
          seen->decimal = true;
          UVar5 = (SVar7 != STEM_DECIMAL_ALWAYS) + UNUM_DECIMAL_SEPARATOR_ALWAYS;
          if (SVar7 == STEM_DECIMAL_AUTO) {
            UVar5 = UNUM_DECIMAL_SEPARATOR_AUTO;
          }
          macros->decimal = UVar5;
          return STATE_NULL;
        }
        break;
      case STEM_PRECISION_INCREMENT:
        if (seen->precision != true) {
          seen->precision = true;
          return STATE_INCREMENT_PRECISION;
        }
        break;
      case STEM_MEASURE_UNIT:
        if (seen->unit != true) {
          seen->unit = true;
          return STATE_MEASURE_UNIT;
        }
        break;
      case STEM_PER_MEASURE_UNIT:
        if (seen->perUnit != true) {
          seen->perUnit = true;
          return STATE_PER_MEASURE_UNIT;
        }
        break;
      case STEM_CURRENCY:
        if (seen->unit != true) {
          seen->unit = true;
          return STATE_CURRENCY_UNIT;
        }
        break;
      case STEM_INTEGER_WIDTH:
        if (seen->integerWidth != true) {
          seen->integerWidth = true;
          return STATE_INTEGER_WIDTH;
        }
        break;
      case STEM_NUMBERING_SYSTEM:
        if (seen->symbols != true) {
          seen->symbols = true;
          return STATE_NUMBERING_SYSTEM;
        }
        break;
      case STEM_SCALE:
        if (seen->scale != true) {
          seen->scale = true;
          return STATE_SCALE;
        }
        break;
      default:
        return STATE_NULL;
      }
      *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
      return STATE_NULL;
    }
  }
  *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
  return STATE_NULL;
}

Assistant:

ParseState
skeleton::parseStem(const StringSegment& segment, const UCharsTrie& stemTrie, SeenMacroProps& seen,
                    MacroProps& macros, UErrorCode& status) {
    // First check for "blueprint" stems, which start with a "signal char"
    switch (segment.charAt(0)) {
        case u'.':
        CHECK_NULL(seen, precision, status);
            blueprint_helpers::parseFractionStem(segment, macros, status);
            return STATE_FRACTION_PRECISION;
        case u'@':
        CHECK_NULL(seen, precision, status);
            blueprint_helpers::parseDigitsStem(segment, macros, status);
            return STATE_NULL;
        default:
            break;
    }

    // Now look at the stemsTrie, which is already be pointing at our stem.
    UStringTrieResult stemResult = stemTrie.current();

    if (stemResult != USTRINGTRIE_INTERMEDIATE_VALUE && stemResult != USTRINGTRIE_FINAL_VALUE) {
        // throw new SkeletonSyntaxException("Unknown stem", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return STATE_NULL;
    }

    auto stem = static_cast<StemEnum>(stemTrie.getValue());
    switch (stem) {

        // Stems with meaning on their own, not requiring an option:

        case STEM_COMPACT_SHORT:
        case STEM_COMPACT_LONG:
        case STEM_SCIENTIFIC:
        case STEM_ENGINEERING:
        case STEM_NOTATION_SIMPLE:
        CHECK_NULL(seen, notation, status);
            macros.notation = stem_to_object::notation(stem);
            switch (stem) {
                case STEM_SCIENTIFIC:
                case STEM_ENGINEERING:
                    return STATE_SCIENTIFIC; // allows for scientific options
                default:
                    return STATE_NULL;
            }

        case STEM_BASE_UNIT:
        case STEM_PERCENT:
        case STEM_PERMILLE:
        CHECK_NULL(seen, unit, status);
            macros.unit = stem_to_object::unit(stem);
            return STATE_NULL;

        case STEM_PRECISION_INTEGER:
        case STEM_PRECISION_UNLIMITED:
        case STEM_PRECISION_CURRENCY_STANDARD:
        case STEM_PRECISION_CURRENCY_CASH:
        CHECK_NULL(seen, precision, status);
            macros.precision = stem_to_object::precision(stem);
            switch (stem) {
                case STEM_PRECISION_INTEGER:
                    return STATE_FRACTION_PRECISION; // allows for "precision-integer/@##"
                default:
                    return STATE_NULL;
            }

        case STEM_ROUNDING_MODE_CEILING:
        case STEM_ROUNDING_MODE_FLOOR:
        case STEM_ROUNDING_MODE_DOWN:
        case STEM_ROUNDING_MODE_UP:
        case STEM_ROUNDING_MODE_HALF_EVEN:
        case STEM_ROUNDING_MODE_HALF_DOWN:
        case STEM_ROUNDING_MODE_HALF_UP:
        case STEM_ROUNDING_MODE_UNNECESSARY:
        CHECK_NULL(seen, roundingMode, status);
            macros.roundingMode = stem_to_object::roundingMode(stem);
            return STATE_NULL;

        case STEM_GROUP_OFF:
        case STEM_GROUP_MIN2:
        case STEM_GROUP_AUTO:
        case STEM_GROUP_ON_ALIGNED:
        case STEM_GROUP_THOUSANDS:
        CHECK_NULL(seen, grouper, status);
            macros.grouper = Grouper::forStrategy(stem_to_object::groupingStrategy(stem));
            return STATE_NULL;

        case STEM_LATIN:
        CHECK_NULL(seen, symbols, status);
            macros.symbols.setTo(NumberingSystem::createInstanceByName("latn", status));
            return STATE_NULL;

        case STEM_UNIT_WIDTH_NARROW:
        case STEM_UNIT_WIDTH_SHORT:
        case STEM_UNIT_WIDTH_FULL_NAME:
        case STEM_UNIT_WIDTH_ISO_CODE:
        case STEM_UNIT_WIDTH_HIDDEN:
        CHECK_NULL(seen, unitWidth, status);
            macros.unitWidth = stem_to_object::unitWidth(stem);
            return STATE_NULL;

        case STEM_SIGN_AUTO:
        case STEM_SIGN_ALWAYS:
        case STEM_SIGN_NEVER:
        case STEM_SIGN_ACCOUNTING:
        case STEM_SIGN_ACCOUNTING_ALWAYS:
        case STEM_SIGN_EXCEPT_ZERO:
        case STEM_SIGN_ACCOUNTING_EXCEPT_ZERO:
        CHECK_NULL(seen, sign, status);
            macros.sign = stem_to_object::signDisplay(stem);
            return STATE_NULL;

        case STEM_DECIMAL_AUTO:
        case STEM_DECIMAL_ALWAYS:
        CHECK_NULL(seen, decimal, status);
            macros.decimal = stem_to_object::decimalSeparatorDisplay(stem);
            return STATE_NULL;

            // Stems requiring an option:

        case STEM_PRECISION_INCREMENT:
        CHECK_NULL(seen, precision, status);
            return STATE_INCREMENT_PRECISION;

        case STEM_MEASURE_UNIT:
        CHECK_NULL(seen, unit, status);
            return STATE_MEASURE_UNIT;

        case STEM_PER_MEASURE_UNIT:
        CHECK_NULL(seen, perUnit, status);
            return STATE_PER_MEASURE_UNIT;

        case STEM_CURRENCY:
        CHECK_NULL(seen, unit, status);
            return STATE_CURRENCY_UNIT;

        case STEM_INTEGER_WIDTH:
        CHECK_NULL(seen, integerWidth, status);
            return STATE_INTEGER_WIDTH;

        case STEM_NUMBERING_SYSTEM:
        CHECK_NULL(seen, symbols, status);
            return STATE_NUMBERING_SYSTEM;

        case STEM_SCALE:
        CHECK_NULL(seen, scale, status);
            return STATE_SCALE;

        default:
            U_ASSERT(false);
            return STATE_NULL; // return a value: silence compiler warning
    }
}